

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O1

int testingMul(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  undefined8 extraout_RAX_08;
  undefined8 extraout_RAX_09;
  size_type sVar5;
  ulong i;
  size_t res;
  BN k_o;
  BN k_m;
  BN f_m;
  BN c_m;
  BN mul;
  BN bn2;
  BN bn1;
  size_type local_150;
  string local_148 [2];
  int local_104;
  ulong local_100;
  ulong local_f8;
  size_t local_f0;
  size_t local_e8;
  ulong local_e0;
  BN local_d8;
  BN local_c0;
  BN local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  undefined7 extraout_var;
  
  paVar1 = &local_148[0].field_2;
  local_100 = 0;
  sVar5 = 0;
  do {
    local_e8 = *(size_t *)((long)&local_148[0]._M_dataplus._M_p + sVar5);
    local_e0 = sVar5;
    local_f0 = *(size_t *)((long)&local_148[0]._M_string_length + sVar5);
    i = 0;
    local_f8 = 0;
    do {
      iVar3 = rand();
      BN::makeRandom(&local_48,(long)(iVar3 % (int)local_e8 + 1));
      iVar3 = rand();
      BN::makeRandom(&local_60,(long)(iVar3 % (int)local_f0 + 1));
      BN::operator*(&local_78,&local_48,&local_60);
      BN::classicMultiplication(&local_90,&local_48,&local_60);
      BN::fastMultiplication(&local_a8,&local_48,&local_60);
      BN::karatsubaMultiplication(&local_c0,&local_48,&local_60);
      BN::karatsubaMultiplication(&local_d8,&local_48,&local_60);
      bVar2 = BN::operator!=(&local_78,&local_90);
      if (bVar2) {
LAB_0010566b:
        local_148[0].field_2._M_local_buf[2] = '1';
        local_148[0].field_2._M_allocated_capacity._0_2_ = 0x6e62;
        local_148[0]._M_string_length = 3;
        local_148[0].field_2._M_local_buf[3] = '\0';
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        anon_unknown.dwarf_3a15::printBN(local_148,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
        }
        local_148[0].field_2._M_local_buf[2] = '2';
        local_148[0].field_2._M_allocated_capacity._0_2_ = 0x6e62;
        local_148[0]._M_string_length = 3;
        local_148[0].field_2._M_local_buf[3] = '\0';
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        anon_unknown.dwarf_3a15::printBN(local_148,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
        }
        local_150 = 0x14;
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        local_148[0]._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_150);
        local_148[0].field_2._M_allocated_capacity._0_2_ = (undefined2)local_150;
        local_148[0].field_2._M_local_buf[2] = (undefined1)(local_150 >> 0x10);
        local_148[0].field_2._M_local_buf[3] = (undefined1)(local_150 >> 0x18);
        local_148[0].field_2._M_allocated_capacity._4_2_ = (undefined2)(local_150 >> 0x20);
        local_148[0].field_2._M_allocated_capacity._6_2_ = (undefined2)(local_150 >> 0x30);
        builtin_strncpy(local_148[0]._M_dataplus._M_p,"bn1 * bn2 operator *",0x14);
        local_148[0]._M_string_length = local_150;
        local_148[0]._M_dataplus._M_p[local_150] = '\0';
        anon_unknown.dwarf_3a15::printBN(local_148,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
        }
        local_150 = 0x11;
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        local_148[0]._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_150);
        local_148[0].field_2._M_allocated_capacity._0_2_ = (undefined2)local_150;
        local_148[0].field_2._M_local_buf[2] = (undefined1)(local_150 >> 0x10);
        local_148[0].field_2._M_local_buf[3] = (undefined1)(local_150 >> 0x18);
        local_148[0].field_2._M_allocated_capacity._4_2_ = (undefined2)(local_150 >> 0x20);
        local_148[0].field_2._M_allocated_capacity._6_2_ = (undefined2)(local_150 >> 0x30);
        builtin_strncpy(local_148[0]._M_dataplus._M_p,"bn1 * bn2 classic",0x11);
        local_148[0]._M_string_length = local_150;
        local_148[0]._M_dataplus._M_p[local_150] = '\0';
        anon_unknown.dwarf_3a15::printBN(local_148,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
        }
        local_148[0].field_2._8_6_ = 0x747361662032;
        local_148[0].field_2._M_allocated_capacity._0_2_ = 0x6e62;
        local_148[0].field_2._M_local_buf[2] = '1';
        local_148[0].field_2._M_local_buf[3] = ' ';
        local_148[0].field_2._M_allocated_capacity._4_2_ = 0x202a;
        local_148[0].field_2._M_allocated_capacity._6_2_ = 0x6e62;
        local_148[0]._M_string_length = 0xe;
        local_148[0].field_2._M_local_buf[0xe] = '\0';
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        anon_unknown.dwarf_3a15::printBN(local_148,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
        }
        local_150 = 0x13;
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        local_148[0]._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_150);
        local_148[0].field_2._M_allocated_capacity._0_2_ = (undefined2)local_150;
        local_148[0].field_2._M_local_buf[2] = (undefined1)(local_150 >> 0x10);
        local_148[0].field_2._M_local_buf[3] = (undefined1)(local_150 >> 0x18);
        local_148[0].field_2._M_allocated_capacity._4_2_ = (undefined2)(local_150 >> 0x20);
        local_148[0].field_2._M_allocated_capacity._6_2_ = (undefined2)(local_150 >> 0x30);
        builtin_strncpy(local_148[0]._M_dataplus._M_p,"bn1 * bn2 karatsuba",0x13);
        local_148[0]._M_string_length = local_150;
        local_148[0]._M_dataplus._M_p[local_150] = '\0';
        anon_unknown.dwarf_3a15::printBN(local_148,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
        }
        local_150 = 0x15;
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        local_148[0]._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_150);
        local_148[0].field_2._M_allocated_capacity._0_2_ = (undefined2)local_150;
        local_148[0].field_2._M_local_buf[2] = (undefined1)(local_150 >> 0x10);
        local_148[0].field_2._M_local_buf[3] = (undefined1)(local_150 >> 0x18);
        local_148[0].field_2._M_allocated_capacity._4_2_ = (undefined2)(local_150 >> 0x20);
        local_148[0].field_2._M_allocated_capacity._6_2_ = (undefined2)(local_150 >> 0x30);
        *(undefined8 *)local_148[0]._M_dataplus._M_p = 0x6e62202a20316e62;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 8) = '2';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 10) = 'k';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xb) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xc) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xe) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xf) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xe) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0xf) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0x10) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0x11) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0x12) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0x13) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148[0]._M_dataplus._M_p + 0x14) = 'o';
        local_148[0]._M_string_length = local_150;
        local_148[0]._M_dataplus._M_p[local_150] = '\0';
        sVar5 = local_150;
        anon_unknown.dwarf_3a15::printBN(local_148,&local_d8);
        uVar4 = extraout_RAX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
          uVar4 = extraout_RAX_00;
        }
        res = 1;
        bVar2 = false;
      }
      else {
        bVar2 = BN::operator!=(&local_78,&local_a8);
        if (bVar2) goto LAB_0010566b;
        bVar2 = BN::operator!=(&local_78,&local_c0);
        if (bVar2) goto LAB_0010566b;
        bVar2 = BN::operator!=(&local_78,&local_d8);
        uVar4 = CONCAT71(extraout_var,bVar2);
        if (bVar2) goto LAB_0010566b;
        res = 0;
        bVar2 = true;
      }
      if (local_d8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_01;
      }
      if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_02;
      }
      if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_03;
      }
      if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_04;
      }
      if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_05;
      }
      if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_06;
      }
      if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar4 = extraout_RAX_07;
      }
      if (!bVar2) {
        local_148[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Multiplication","");
        sVar5 = i;
        anon_unknown.dwarf_3a15::printTestError(local_148,local_e8,local_f0,i,res);
        uVar4 = extraout_RAX_08;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_148[0]._M_dataplus._M_p);
          uVar4 = extraout_RAX_09;
        }
        local_104 = (int)res;
      }
      if (!bVar2) goto LAB_001059ea;
      bVar2 = 0x1869e < i;
      i = i + 1;
      sVar5 = CONCAT71((int7)(sVar5 >> 8),bVar2);
      local_f8 = sVar5;
    } while (i != 100000);
    uVar4 = 100000;
LAB_001059ea:
    if ((local_f8 & 1) == 0) break;
    sVar5 = local_e0 + 0x10;
    local_100 = CONCAT71((int7)((ulong)uVar4 >> 8),sVar5 == 0x40);
  } while (sVar5 != 0x40);
  if ((local_100 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Multiple test: OK",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    local_104 = 0;
  }
  return local_104;
}

Assistant:

int testingMul() {
    for (auto sizes : defaultSizes()) {
        size_t max1 = sizes.first;
        size_t max2 = sizes.second;
        for(int i = 0; i < 100000; i++) {
            if (int res=testingMul_ij(max1, max2)) {
                printTestError("Multiplication", max1, max2, i, res);
                return res;
            }
        }
    }
    cout << "Multiple test: OK" << endl;
    return 0;
}